

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O1

void __thiscall
cimg_library::CImgIOException::CImgIOException(CImgIOException *this,char *format,...)

{
  char in_AL;
  uint *puVar1;
  FILE *__stream;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  undefined8 local_e8;
  void **local_e0;
  undefined1 *local_d8;
  undefined1 local_c8 [16];
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  
  if (in_AL != '\0') {
    local_98 = in_XMM0_Qa;
    local_88 = in_XMM1_Qa;
    local_78 = in_XMM2_Qa;
    local_68 = in_XMM3_Qa;
    local_58 = in_XMM4_Qa;
    local_48 = in_XMM5_Qa;
    local_38 = in_XMM6_Qa;
    local_28 = in_XMM7_Qa;
  }
  local_b8 = in_RDX;
  local_b0 = in_RCX;
  local_a8 = in_R8;
  local_a0 = in_R9;
  CImgException::CImgException(&this->super_CImgException);
  *(undefined ***)&this->super_CImgException = &PTR__CImgException_00156cd8;
  local_e0 = &ap[0].overflow_arg_area;
  local_e8 = 0x3000000010;
  local_d8 = local_c8;
  vsnprintf((this->super_CImgException)._message,0x4000,format,&local_e8);
  puVar1 = cimg::_exception_mode(0,false);
  if (*puVar1 != 0) {
    __stream = (FILE *)cimg::output((FILE *)0x0);
    fprintf(__stream,"\n%s[CImg] *** %s ***%s %s\n","","CImgIOException","",
            (this->super_CImgException)._message);
    puVar1 = cimg::_exception_mode(0,false);
    if (2 < *puVar1) {
      cimg::info();
    }
  }
  return;
}

Assistant:

CImgIOException(const char *const format, ...) { _cimg_exception_err("CImgIOException",true); }